

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

void * IM483IThread(void *pParam)

{
  double dVar1;
  int iVar2;
  long lVar3;
  undefined4 uVar4;
  CRITICAL_SECTION *__mutex;
  timespec req;
  timespec local_40;
  
  __mutex = IM483ICS;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsIM483I + lVar3 * 2) == pParam) {
      local_40.tv_sec = (__time_t)(*(int *)((long)pParam + 0x52c) / 1000);
      local_40.tv_nsec = (long)((*(int *)((long)pParam + 0x52c) % 1000) * 1000000);
      uVar4 = 0;
      nanosleep(&local_40,(timespec *)0x0);
      do {
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        dVar1 = *(double *)((long)angleIM483I + lVar3 * 2);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        iVar2 = (int)((dVar1 * 116000.0) /
                     (*(double *)((long)pParam + 0x560) - *(double *)((long)pParam + 0x558)));
        if (0x1c51f < iVar2) {
          iVar2 = 0x1c520;
        }
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        iVar2 = SetMotorRelativeIM483I((IM483I *)pParam,-iVar2,-(uint)(dVar1 == 0.0) & 1);
        if (iVar2 != 0) {
          uVar4 = 1;
        }
        local_40.tv_sec = (__time_t)(*(int *)((long)pParam + 0x52c) / 1000);
        local_40.tv_nsec = (long)((*(int *)((long)pParam + 0x52c) % 1000) * 1000000);
        nanosleep(&local_40,(timespec *)0x0);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        *(undefined4 *)((long)resIM483I + lVar3) = uVar4;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitIM483I + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I* pIM483I = (IM483I*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angle = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	mSleep(pIM483I->threadperiod);

	for (;;)
	{
		EnterCriticalSection(&IM483ICS[id]);
		angle = angleIM483I[id];
		LeaveCriticalSection(&IM483ICS[id]);
		res = SetMaxAngleIM483I(pIM483I, angle);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(pIM483I->threadperiod);
		EnterCriticalSection(&IM483ICS[id]);
		resIM483I[id] = err;
		LeaveCriticalSection(&IM483ICS[id]);
		if (bExitIM483I[id]) break;
	}

	return 0;
}